

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void QFileDialog::saveFileContent(QByteArray *fileContent,QString *fileNameHint,QWidget *parent)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  QWidget *this;
  undefined4 *puVar3;
  Data *pDVar4;
  long in_FS_OFFSET;
  uint in_stack_ffffffffffffff3c;
  QObject local_a0 [8];
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QWidget *)operator_new(0x28);
  local_58.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  local_78.size = 0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  local_98.size = 0;
  QFileDialog((QFileDialog *)this,parent,(QString *)&local_58,(QString *)&local_78,
              (QString *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  setAcceptMode((QFileDialog *)this,AcceptSave);
  setFileMode((QFileDialog *)this,AnyFile);
  selectFile((QFileDialog *)this,fileNameHint);
  local_58.d = (Data *)(fileContent->d).d;
  pcVar1 = (char16_t *)(fileContent->d).ptr;
  qVar2 = (fileContent->d).size;
  pDVar4 = (Data *)0x0;
  if (local_58.d != (Data *)0x0) {
    LOCK();
    (((Data *)local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pDVar4 = (Data *)local_58.d;
  }
  local_78.d = (Data *)fileSelected;
  local_78.ptr = (char16_t *)0x0;
  local_58.ptr = pcVar1;
  local_58.size = qVar2;
  puVar3 = (undefined4 *)operator_new(0x28);
  *puVar3 = 1;
  *(code **)(puVar3 + 2) =
       QtPrivate::
       QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/dialogs/qfiledialog.cpp:2369:25),_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(Data **)(puVar3 + 4) = pDVar4;
  *(char16_t **)(puVar3 + 6) = pcVar1;
  *(qsizetype *)(puVar3 + 8) = qVar2;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QObject::connectImpl
            (local_a0,(void **)this,(QObject *)&local_78,(void **)this,(QSlotObjectBase *)0x0,
             (ConnectionType)puVar3,(int *)((ulong)in_stack_ffffffffffffff3c << 0x20),
             (QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  QWidget::setAttribute(this,WA_DeleteOnClose,true);
  QWidget::show(this);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialog::saveFileContent(const QByteArray &fileContent, const QString &fileNameHint, QWidget *parent)
{
#ifdef Q_OS_WASM
    Q_UNUSED(parent);
    QWasmLocalFileAccess::saveFile(fileContent, fileNameHint.toStdString());
#else
    QFileDialog *dialog = new QFileDialog(parent);
    dialog->setAcceptMode(QFileDialog::AcceptSave);
    dialog->setFileMode(QFileDialog::AnyFile);
    dialog->selectFile(fileNameHint);

    auto fileSelected = [=](const QString &fileName) {
        if (!fileName.isNull()) {
            QFile selectedFile(fileName);
            if (selectedFile.open(QIODevice::WriteOnly))
                selectedFile.write(fileContent);
        }
    };

    connect(dialog, &QFileDialog::fileSelected, dialog, fileSelected);
    dialog->setAttribute(Qt::WA_DeleteOnClose);
    dialog->show();
#endif
}